

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O2

duckdb_state
duckdb_bind_value(duckdb_prepared_statement prepared_statement,idx_t param_idx,duckdb_value val)

{
  duckdb_prepared_statement this;
  bool bVar1;
  pointer pPVar2;
  mapped_type *this_00;
  allocator local_119;
  string identifier;
  InvalidInputException local_f8;
  Value local_e8;
  ErrorData local_a8;
  
  if ((prepared_statement != (duckdb_prepared_statement)0x0) &&
     (*(long *)(prepared_statement + 0x38) != 0)) {
    this = prepared_statement + 0x38;
    pPVar2 = duckdb::
             unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
             ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                           *)this);
    bVar1 = duckdb::PreparedStatement::HasError(pPVar2);
    if (!bVar1) {
      if ((param_idx != 0) &&
         (pPVar2 = duckdb::
                   unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                   ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                                 *)this),
         param_idx <= (pPVar2->named_param_map)._M_h._M_element_count)) {
        duckdb_parameter_name_internal_abi_cxx11_(&identifier,prepared_statement,param_idx);
        duckdb::Value::Value(&local_e8,(Value *)val);
        duckdb::BoundParameterData::BoundParameterData((BoundParameterData *)&local_a8,&local_e8);
        this_00 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)prepared_statement,&identifier);
        duckdb::BoundParameterData::operator=(this_00,(BoundParameterData *)&local_a8);
        duckdb::BoundParameterData::~BoundParameterData((BoundParameterData *)&local_a8);
        duckdb::Value::~Value(&local_e8);
        std::__cxx11::string::~string((string *)&identifier);
        return DuckDBSuccess;
      }
      std::__cxx11::string::string
                ((string *)&identifier,
                 "Can not bind to parameter number %d, statement only has %d parameter(s)",
                 &local_119);
      pPVar2 = duckdb::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                             *)this);
      duckdb::InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                (&local_f8,&identifier,param_idx,(pPVar2->named_param_map)._M_h._M_element_count);
      duckdb::ErrorData::ErrorData(&local_a8,(exception *)&local_f8);
      pPVar2 = duckdb::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                             *)this);
      duckdb::ErrorData::operator=(&pPVar2->error,&local_a8);
      duckdb::ErrorData::~ErrorData(&local_a8);
      std::runtime_error::~runtime_error((runtime_error *)&local_f8);
      std::__cxx11::string::~string((string *)&identifier);
    }
  }
  return DuckDBError;
}

Assistant:

duckdb_state duckdb_bind_value(duckdb_prepared_statement prepared_statement, idx_t param_idx, duckdb_value val) {
	auto value = reinterpret_cast<Value *>(val);
	auto wrapper = reinterpret_cast<PreparedStatementWrapper *>(prepared_statement);
	if (!wrapper || !wrapper->statement || wrapper->statement->HasError()) {
		return DuckDBError;
	}
	if (param_idx <= 0 || param_idx > wrapper->statement->named_param_map.size()) {
		wrapper->statement->error =
		    duckdb::InvalidInputException("Can not bind to parameter number %d, statement only has %d parameter(s)",
		                                  param_idx, wrapper->statement->named_param_map.size());
		return DuckDBError;
	}
	auto identifier = duckdb_parameter_name_internal(prepared_statement, param_idx);
	wrapper->values[identifier] = duckdb::BoundParameterData(*value);
	return DuckDBSuccess;
}